

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_set_param(vdpp2_api_ctx *ctx,vdpp_api_content *param,VDPP_PARAM_TYPE type)

{
  uint uVar1;
  ushort uVar2;
  RK_U32 RVar3;
  RK_U16 cfg_set;
  RK_U16 mask;
  VDPP_PARAM_TYPE type_local;
  vdpp_api_content *param_local;
  vdpp2_api_ctx *ctx_local;
  
  switch(type) {
  case VDPP_PARAM_TYPE_COM:
    (ctx->params).hist_cnt_en = 0;
    (ctx->params).src_fmt = 3;
    (ctx->params).src_yuv_swap = (param->com).sswap;
    (ctx->params).dst_fmt = (param->com).dfmt;
    (ctx->params).dst_yuv_swap = (param->com).dswap;
    (ctx->params).src_width = (param->com).src_width;
    (ctx->params).src_height = (param->com).src_height;
    (ctx->params).dst_width = (param->com).dst_width;
    (ctx->params).dst_height = (param->com).dst_height;
    (ctx->params).dmsr_params.dmsr_enable = true;
    (ctx->params).es_params.es_bEnabledES = 1;
    (ctx->params).shp_params.sharp_enable = 1;
    if ((ctx->params).src_width_vir == 0) {
      (ctx->params).src_width_vir = (ctx->params).src_width + 0xf & 0xfffffff0;
    }
    if ((ctx->params).src_height_vir == 0) {
      (ctx->params).src_height_vir = (ctx->params).src_height + 7 & 0xfffffff8;
    }
    if ((ctx->params).dst_width == 0) {
      (ctx->params).dst_width = (ctx->params).src_width;
    }
    if ((ctx->params).dst_height == 0) {
      (ctx->params).dst_height = (ctx->params).src_height;
    }
    if ((ctx->params).dst_width_vir == 0) {
      (ctx->params).dst_width_vir = (ctx->params).dst_width + 0xf & 0xfffffff0;
    }
    if ((ctx->params).dst_height_vir == 0) {
      (ctx->params).dst_height_vir = (ctx->params).dst_height + 1 & 0xfffffffe;
    }
    if ((ctx->params).dst_c_width == 0) {
      (ctx->params).dst_c_width = (ctx->params).dst_width;
    }
    if ((ctx->params).dst_c_width_vir == 0) {
      (ctx->params).dst_c_width_vir = (ctx->params).dst_c_width + 0xf & 0xfffffff0;
    }
    if ((ctx->params).dst_c_height == 0) {
      (ctx->params).dst_c_height = (ctx->params).dst_height;
    }
    if ((ctx->params).dst_c_height_vir == 0) {
      (ctx->params).dst_c_height_vir = (ctx->params).dst_c_height + 1 & 0xfffffffe;
    }
    update_dci_ctl(&ctx->params);
    break;
  case VDPP_PARAM_TYPE_DMSR:
    memcpy(&(ctx->params).dmsr_params,param,0x84);
    break;
  case VDPP_PARAM_TYPE_ZME_COM:
    (ctx->params).zme_params.zme_bypass_en = (uint)(param->field7[0] & 1);
    (ctx->params).zme_params.zme_dering_enable = (uint)(param->field7[1] & 1);
    (ctx->params).zme_params.zme_dering_sen_0 = (param->com).dfmt;
    (ctx->params).zme_params.zme_dering_sen_1 = (param->com).dswap;
    (ctx->params).zme_params.zme_dering_blend_alpha = (param->com).src_width;
    (ctx->params).zme_params.zme_dering_blend_beta = (param->com).src_height;
    break;
  case VDPP_PARAM_TYPE_ZME_COEFF:
    if ((param->zme).tap8_coeff != (RK_S16 (*) [17] [8])0x0) {
      (ctx->params).zme_params.zme_tap8_coeff = (param->zme).tap8_coeff;
    }
    if ((param->zme).tap6_coeff != (RK_S16 (*) [17] [8])0x0) {
      (ctx->params).zme_params.zme_tap6_coeff = (param->zme).tap6_coeff;
    }
    break;
  default:
    break;
  case VDPP_PARAM_TYPE_COM2:
    uVar1 = (param->dmsr).diff_core_wgt2;
    uVar2 = (ushort)(param->dmsr).diff_core_wgt2 & (ushort)(uVar1 >> 0x10) & 7;
    (ctx->params).src_yuv_swap = (param->com).dfmt;
    (ctx->params).src_fmt = (param->com).sswap;
    (ctx->params).dst_fmt = (param->com).dswap;
    (ctx->params).dst_yuv_swap = (param->com).src_width;
    (ctx->params).src_width = (param->com).src_height;
    (ctx->params).src_height = (param->com).dst_width;
    (ctx->params).src_width_vir = (param->com).dst_height;
    (ctx->params).src_height_vir = (param->dmsr).wgt_pri_gain_odd_2;
    (ctx->params).dst_width = (param->dmsr).wgt_sec_gain;
    (ctx->params).dst_height = (param->dmsr).blk_flat_th;
    (ctx->params).dst_width_vir = (param->dmsr).contrast_to_conf_map_x0;
    (ctx->params).dst_height_vir = (param->dmsr).contrast_to_conf_map_x1;
    (ctx->params).yuv_out_diff = (param->dmsr).contrast_to_conf_map_y0;
    (ctx->params).dst_c_width = (param->dmsr).contrast_to_conf_map_y1;
    (ctx->params).dst_c_height = (param->dmsr).diff_core_th0;
    (ctx->params).dst_c_width_vir = (param->dmsr).diff_core_th1;
    (ctx->params).dst_c_height_vir = (param->dmsr).diff_core_wgt0;
    RVar3 = 2;
    if ((param->dmsr).diff_core_wgt1 != 0) {
      RVar3 = 3;
    }
    (ctx->params).working_mode = RVar3;
    if ((uVar1 & 0x40000) != 0) {
      (ctx->params).dmsr_params.dmsr_enable = (uVar2 & 4) != 0;
    }
    if ((uVar1 & 0x20000) != 0) {
      (ctx->params).es_params.es_bEnabledES = (uint)((uVar2 & 2) != 0);
    }
    if ((uVar1 & 0x10000) != 0) {
      (ctx->params).shp_params.sharp_enable = (uint)((uVar2 & 1) != 0);
    }
    update_dci_ctl(&ctx->params);
    break;
  case VDPP_PARAM_TYPE_ES:
    memcpy(&(ctx->params).es_params,param,0x8c);
    update_es_tan(&(ctx->params).es_params);
    break;
  case VDPP_PARAM_TYPE_HIST:
    (ctx->params).hist_cnt_en = (param->com).sswap;
    (ctx->params).dci_hsd_mode = (param->com).dfmt;
    (ctx->params).dci_vsd_mode = (param->com).dswap;
    (ctx->params).dci_yrgb_gather_num = (param->com).src_width;
    (ctx->params).dci_yrgb_gather_en = (param->com).src_height;
    (ctx->params).dci_csc_range = (param->com).dst_width;
    update_dci_ctl(&ctx->params);
    break;
  case VDPP_PARAM_TYPE_SHARP:
    memcpy(&(ctx->params).shp_params,param,0x554);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vdpp2_set_param(struct vdpp2_api_ctx *ctx,
                               union vdpp_api_content *param,
                               enum VDPP_PARAM_TYPE type)
{
    RK_U16 mask;
    RK_U16 cfg_set;

    switch (type) {
    case VDPP_PARAM_TYPE_COM: // deprecated config
        ctx->params.hist_cnt_en = 0; // default disable

        ctx->params.src_fmt = VDPP_FMT_YUV420; // default 420
        ctx->params.src_yuv_swap = param->com.sswap;
        ctx->params.dst_fmt = param->com.dfmt;
        ctx->params.dst_yuv_swap = param->com.dswap;
        ctx->params.src_width = param->com.src_width;
        ctx->params.src_height = param->com.src_height;
        ctx->params.dst_width = param->com.dst_width;
        ctx->params.dst_height = param->com.dst_height;

        ctx->params.dmsr_params.dmsr_enable = 1;
        ctx->params.es_params.es_bEnabledES = 1;
        ctx->params.shp_params.sharp_enable = 1;
        /* set default vir stride */
        if (!ctx->params.src_width_vir)
            ctx->params.src_width_vir = MPP_ALIGN(ctx->params.src_width, 16);
        if (!ctx->params.src_height_vir)
            ctx->params.src_height_vir = MPP_ALIGN(ctx->params.src_height, 8);
        if (!ctx->params.dst_width)
            ctx->params.dst_width = ctx->params.src_width;
        if (!ctx->params.dst_height)
            ctx->params.dst_height = ctx->params.src_height;
        if (!ctx->params.dst_width_vir)
            ctx->params.dst_width_vir = MPP_ALIGN(ctx->params.dst_width, 16);
        if (!ctx->params.dst_height_vir)
            ctx->params.dst_height_vir = MPP_ALIGN(ctx->params.dst_height, 2);
        /* set default chrome stride */
        if (!ctx->params.dst_c_width)
            ctx->params.dst_c_width = ctx->params.dst_width;
        if (!ctx->params.dst_c_width_vir)
            ctx->params.dst_c_width_vir = MPP_ALIGN(ctx->params.dst_c_width, 16);
        if (!ctx->params.dst_c_height)
            ctx->params.dst_c_height = ctx->params.dst_height;
        if (!ctx->params.dst_c_height_vir)
            ctx->params.dst_c_height_vir = MPP_ALIGN(ctx->params.dst_c_height, 2);
        update_dci_ctl(&ctx->params);
        break;
    case VDPP_PARAM_TYPE_DMSR:
        memcpy(&ctx->params.dmsr_params, &param->dmsr, sizeof(struct dmsr_params));
        break;
    case VDPP_PARAM_TYPE_ZME_COM:
        ctx->params.zme_params.zme_bypass_en = param->zme.bypass_enable;
        ctx->params.zme_params.zme_dering_enable = param->zme.dering_enable;
        ctx->params.zme_params.zme_dering_sen_0 = param->zme.dering_sen_0;
        ctx->params.zme_params.zme_dering_sen_1 = param->zme.dering_sen_1;
        ctx->params.zme_params.zme_dering_blend_alpha = param->zme.dering_blend_alpha;
        ctx->params.zme_params.zme_dering_blend_beta = param->zme.dering_blend_beta;
        break;
    case VDPP_PARAM_TYPE_ZME_COEFF:
        if (param->zme.tap8_coeff != NULL)
            ctx->params.zme_params.zme_tap8_coeff = param->zme.tap8_coeff;
        if (param->zme.tap6_coeff != NULL)
            ctx->params.zme_params.zme_tap6_coeff = param->zme.tap6_coeff;
        break;
    case VDPP_PARAM_TYPE_COM2:
        mask = (param->com2.cfg_set >> 16) & 0x7;
        cfg_set = (param->com2.cfg_set >> 0) & mask;

        ctx->params.src_yuv_swap = param->com2.sswap;
        ctx->params.src_fmt = param->com2.sfmt;
        ctx->params.dst_fmt = param->com2.dfmt;
        ctx->params.dst_yuv_swap = param->com2.dswap;
        ctx->params.src_width = param->com2.src_width;
        ctx->params.src_height = param->com2.src_height;
        ctx->params.src_width_vir = param->com2.src_width_vir;
        ctx->params.src_height_vir = param->com2.src_height_vir;
        ctx->params.dst_width = param->com2.dst_width;
        ctx->params.dst_height = param->com2.dst_height;
        ctx->params.dst_width_vir = param->com2.dst_width_vir;
        ctx->params.dst_height_vir = param->com2.dst_height_vir;
        ctx->params.yuv_out_diff = param->com2.yuv_out_diff;
        ctx->params.dst_c_width = param->com2.dst_c_width;
        ctx->params.dst_c_height = param->com2.dst_c_height;
        ctx->params.dst_c_width_vir = param->com2.dst_c_width_vir;
        ctx->params.dst_c_height_vir = param->com2.dst_c_height_vir;
        ctx->params.working_mode = param->com2.hist_mode_en ?
                                   VDPP_WORK_MODE_DCI : VDPP_WORK_MODE_VEP;
        if (mask & VDPP_DMSR_EN)
            ctx->params.dmsr_params.dmsr_enable = (cfg_set & VDPP_DMSR_EN) ? 1 : 0;
        if (mask & VDPP_ES_EN)
            ctx->params.es_params.es_bEnabledES = (cfg_set & VDPP_ES_EN) ? 1 : 0;
        if (mask & VDPP_SHARP_EN)
            ctx->params.shp_params.sharp_enable = (cfg_set & VDPP_SHARP_EN) ? 1 : 0;
        update_dci_ctl(&ctx->params);
        break;
    case VDPP_PARAM_TYPE_ES:
        memcpy(&ctx->params.es_params, &param->es, sizeof(EsParams));
        update_es_tan(&ctx->params.es_params);
        break;
    case VDPP_PARAM_TYPE_HIST:
        ctx->params.hist_cnt_en = param->hist.hist_cnt_en;
        ctx->params.dci_hsd_mode = param->hist.dci_hsd_mode;
        ctx->params.dci_vsd_mode = param->hist.dci_vsd_mode;
        ctx->params.dci_yrgb_gather_num = param->hist.dci_yrgb_gather_num;
        ctx->params.dci_yrgb_gather_en = param->hist.dci_yrgb_gather_en;
        ctx->params.dci_csc_range = param->hist.dci_csc_range;
        update_dci_ctl(&ctx->params);
        break;
    case VDPP_PARAM_TYPE_SHARP:
        memcpy(&ctx->params.shp_params, &param->sharp, sizeof(ShpParams));
        break;
    default:
        break;
    }

    return MPP_OK;
}